

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O3

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::SetCurrentNetwork
          (PersistentStorageJson *this,RegistrarId *aNwkId)

{
  value_t vVar1;
  json_value jVar2;
  Status SVar3;
  Status SVar4;
  reference this_00;
  undefined1 local_30 [8];
  json_value local_28;
  
  SVar3 = CacheFromFile(this);
  SVar4 = kError;
  if (SVar3 == kSuccess) {
    local_30[0] = null;
    local_28.object = (object_t *)0x0;
    to_json((json *)local_30,(NetworkId *)aNwkId);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((json *)local_30);
    this_00 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](&this->mCache,(key_type *)JSON_CURR_NWK_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_30);
    vVar1 = this_00->m_type;
    this_00->m_type = local_30[0];
    jVar2 = this_00->m_value;
    this_00->m_value = local_28;
    local_30[0] = vVar1;
    local_28 = jVar2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(this_00);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_30 + 8),local_30[0]);
    SVar4 = CacheToFile(this);
  }
  return SVar4;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::SetCurrentNetwork(const NetworkId &aNwkId)
{
    if (CacheFromFile() != PersistentStorage::Status::kSuccess)
    {
        return PersistentStorage::Status::kError;
    }

    mCache[JSON_CURR_NWK] = aNwkId;

    return CacheToFile();
}